

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_html_generator.cc
# Opt level: O2

void __thiscall t_html_generator::print_fn_args_doc(t_html_generator *this,t_function *tfunction)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  bool bVar4;
  pointer pptVar5;
  vector<t_field_*,_std::allocator<t_field_*>_> excepts;
  vector<t_field_*,_std::allocator<t_field_*>_> args;
  _Vector_base<t_field_*,_std::allocator<t_field_*>_> local_80;
  _Vector_base<t_field_*,_std::allocator<t_field_*>_> local_68;
  string local_50;
  
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&local_68,
             &tfunction->arglist_->members_);
  if (local_68._M_impl.super__Vector_impl_data._M_start !=
      local_68._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = false;
    for (pptVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
        pptVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      if (((*pptVar5)->super_t_doc).has_doc_ == true) {
        bVar4 = (bool)(bVar4 | ((*pptVar5)->super_t_doc).doc_._M_string_length != 0);
      }
    }
    if (bVar4) {
      poVar1 = &this->f_out_;
      poVar3 = std::operator<<((ostream *)poVar1,"<br/><h4 id=\"Parameters_");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_t_generator).service_name_);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = std::operator<<(poVar3,(string *)&tfunction->name_);
      poVar3 = std::operator<<(poVar3,"\">Parameters</h4>");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)poVar1,
                      "<table class=\"table-bordered table-striped table-condensed\">");
      std::operator<<((ostream *)poVar1,
                      "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>");
      for (pptVar5 = local_68._M_impl.super__Vector_impl_data._M_start;
          pptVar5 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
        poVar3 = std::operator<<((ostream *)poVar1,"<tr><td>");
        std::operator<<(poVar3,(string *)&(*pptVar5)->name_);
        std::operator<<((ostream *)poVar1,"</td><td>");
        escape_html(&local_50,this,&((*pptVar5)->super_t_doc).doc_);
        std::operator<<((ostream *)poVar1,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar3 = std::operator<<((ostream *)poVar1,"</td></tr>");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      std::operator<<((ostream *)poVar1,"</tbody></table>");
    }
  }
  std::vector<t_field_*,_std::allocator<t_field_*>_>::vector
            ((vector<t_field_*,_std::allocator<t_field_*>_> *)&local_80,
             &tfunction->xceptions_->members_);
  if (local_80._M_impl.super__Vector_impl_data._M_start !=
      local_80._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = false;
    for (pptVar5 = local_80._M_impl.super__Vector_impl_data._M_start;
        pptVar5 != local_80._M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
      if (((*pptVar5)->super_t_doc).has_doc_ == true) {
        bVar4 = (bool)(bVar4 | ((*pptVar5)->super_t_doc).doc_._M_string_length != 0);
      }
    }
    if (bVar4) {
      poVar1 = &this->f_out_;
      poVar3 = std::operator<<((ostream *)poVar1,"<br/><h4 id=\"Exceptions_");
      poVar3 = std::operator<<(poVar3,(string *)&(this->super_t_generator).service_name_);
      poVar3 = std::operator<<(poVar3,"_");
      poVar3 = std::operator<<(poVar3,(string *)&tfunction->name_);
      poVar3 = std::operator<<(poVar3,"\">Exceptions</h4>");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::operator<<((ostream *)poVar1,
                      "<table class=\"table-bordered table-striped table-condensed\">");
      std::operator<<((ostream *)poVar1,
                      "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>");
      for (pptVar5 = local_80._M_impl.super__Vector_impl_data._M_start;
          pptVar5 != local_80._M_impl.super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
        poVar3 = std::operator<<((ostream *)poVar1,"<tr><td>");
        iVar2 = (*((*pptVar5)->type_->super_t_doc)._vptr_t_doc[3])();
        std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
        std::operator<<((ostream *)poVar1,"</td><td>");
        escape_html(&local_50,this,&((*pptVar5)->super_t_doc).doc_);
        std::operator<<((ostream *)poVar1,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        poVar3 = std::operator<<((ostream *)poVar1,"</td></tr>");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
      std::operator<<((ostream *)poVar1,"</tbody></table>");
    }
  }
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base(&local_80);
  std::_Vector_base<t_field_*,_std::allocator<t_field_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void t_html_generator::print_fn_args_doc(t_function* tfunction) {
  bool has_docs = false;
  vector<t_field*> args = tfunction->get_arglist()->get_members();
  vector<t_field*>::iterator arg_iter = args.begin();
  if (arg_iter != args.end()) {
    for (; arg_iter != args.end(); arg_iter++) {
      if ((*arg_iter)->has_doc() && !(*arg_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      arg_iter = args.begin();
      f_out_ << "<br/><h4 id=\"Parameters_" << service_name_ << "_" << tfunction->get_name()
             << "\">Parameters</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Name</th><th>Description</th></tr></thead><tbody>";
      for (; arg_iter != args.end(); arg_iter++) {
        f_out_ << "<tr><td>" << (*arg_iter)->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*arg_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }

  has_docs = false;
  vector<t_field*> excepts = tfunction->get_xceptions()->get_members();
  vector<t_field*>::iterator ex_iter = excepts.begin();
  if (ex_iter != excepts.end()) {
    for (; ex_iter != excepts.end(); ex_iter++) {
      if ((*ex_iter)->has_doc() && !(*ex_iter)->get_doc().empty())
        has_docs = true;
    }
    if (has_docs) {
      ex_iter = excepts.begin();
      f_out_ << "<br/><h4 id=\"Exceptions_" << service_name_ << "_" << tfunction->get_name()
             << "\">Exceptions</h4>" << endl;
      f_out_ << "<table class=\"table-bordered table-striped table-condensed\">";
      f_out_ << "<thead><tr><th>Type</th><th>Description</th></tr></thead><tbody>";
      for (; ex_iter != excepts.end(); ex_iter++) {
        f_out_ << "<tr><td>" << (*ex_iter)->get_type()->get_name();
        f_out_ << "</td><td>";
        f_out_ << escape_html((*ex_iter)->get_doc());
        f_out_ << "</td></tr>" << endl;
      }
      f_out_ << "</tbody></table>";
    }
  }
}